

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,int _c,size_t _elemsize,Allocator *_allocator)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(this->dims == 3);
  auVar6._4_4_ = -(uint)(_w == this->w);
  auVar6._8_4_ = -(uint)(_h == this->h);
  auVar6._12_4_ = -(uint)(_c == this->c);
  iVar1 = movmskps(3,auVar6);
  if ((((iVar1 != 0xf) || (this->elempack != 1)) || (this->allocator != _allocator)) ||
     (this->elemsize != _elemsize)) {
    release(this);
    this->elemsize = _elemsize;
    this->elempack = 1;
    this->allocator = _allocator;
    this->dims = 3;
    this->w = _w;
    this->h = _h;
    this->c = _c;
    uVar2 = (long)(_h * _w) * _elemsize + 0xf & 0xfffffffffffffff0;
    uVar3 = uVar2 / _elemsize;
    this->cstep = uVar3;
    lVar5 = (long)_c * uVar3;
    if (lVar5 != 0) {
      uVar3 = lVar5 * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        pvVar4 = ncnn::fastMalloc(uVar3 + 4);
      }
      else {
        pvVar4 = (void *)(**(code **)(*(long *)_allocator + 0x10))
                                   (_allocator,uVar3 + 4,uVar2 % _elemsize);
      }
      this->data = pvVar4;
      this->refcount = (int *)((long)pvVar4 + uVar3);
      *(undefined4 *)((long)pvVar4 + uVar3) = 1;
    }
  }
  return;
}

Assistant:

inline void Mat::create(int _w, int _h, int _c, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 3 && w == _w && h == _h && c == _c && elemsize == _elemsize && elempack == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = 1;
    allocator = _allocator;

    dims = 3;
    w = _w;
    h = _h;
    c = _c;

    cstep = alignSize(w * h * elemsize, 16) / elemsize;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}